

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlFreeValidCtxt(PyObject *self,PyObject *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  int iVar4;
  long in_RAX;
  PyObject *pPVar5;
  PyObject *pyobj_cur;
  long local_18;
  
  pPVar5 = (PyObject *)0x0;
  local_18 = in_RAX;
  iVar4 = _PyArg_ParseTuple_SizeT(args,"O:xmlFreeValidCtxt",&local_18);
  if (iVar4 != 0) {
    puVar1 = *(undefined8 **)(local_18 + 0x10);
    puVar2 = (undefined8 *)*puVar1;
    if (puVar2 != (undefined8 *)0x0) {
      plVar3 = (long *)puVar2[1];
      if ((plVar3 != (long *)0x0) && (*plVar3 = *plVar3 + -1, *plVar3 == 0)) {
        _Py_Dealloc();
      }
      plVar3 = (long *)*puVar2;
      if ((plVar3 != (long *)0x0) && (*plVar3 = *plVar3 + -1, *plVar3 == 0)) {
        _Py_Dealloc();
      }
      plVar3 = (long *)puVar2[2];
      if ((plVar3 != (long *)0x0) && (*plVar3 = *plVar3 + -1, *plVar3 == 0)) {
        _Py_Dealloc();
      }
      (*_xmlFree)(puVar2);
    }
    xmlFreeValidCtxt(puVar1);
    pPVar5 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  return pPVar5;
}

Assistant:

static PyObject *
libxml_xmlFreeValidCtxt(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    xmlValidCtxtPtr cur;
    xmlValidCtxtPyCtxtPtr pyCtxt;
    PyObject *pyobj_cur;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlFreeValidCtxt", &pyobj_cur))
        return(NULL);
    cur = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_cur);

    pyCtxt = (xmlValidCtxtPyCtxtPtr)(cur->userData);
    if (pyCtxt != NULL)
    {
            Py_XDECREF(pyCtxt->error);
            Py_XDECREF(pyCtxt->warn);
            Py_XDECREF(pyCtxt->arg);
            xmlFree(pyCtxt);
    }

    xmlFreeValidCtxt(cur);
    Py_INCREF(Py_None);
    return(Py_None);
}